

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::CopyImage::FunctionalTest::copyAndVerify
          (FunctionalTest *this,testCase *test_case,GLubyte **dst_pixels,GLubyte **src_pixels)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  TestError *this_00;
  bool bVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_428;
  MessageBuilder local_418;
  GetNameFunc local_298;
  int local_290;
  Enum<int,_2UL> local_288;
  GetNameFunc local_278;
  int local_270;
  Enum<int,_2UL> local_268;
  GetNameFunc local_258;
  int local_250;
  Enum<int,_2UL> local_248;
  GetNameFunc local_238;
  int local_230;
  Enum<int,_2UL> local_228 [2];
  MessageBuilder local_208;
  uint local_88;
  uint local_84;
  GLuint layer;
  GLuint src_layer;
  GLuint dst_layer;
  GLuint n_layers;
  GLuint src_layer_step;
  bool result;
  bool is_src_multi_layer;
  uint uStack_6c;
  bool is_dst_multi_layer;
  GLuint dst_layer_step;
  GLuint region_depth;
  Functions *gl;
  GLubyte **ppGStack_58;
  GLenum error;
  GLubyte **src_pixels_local;
  GLubyte **dst_pixels_local;
  testCase *test_case_local;
  FunctionalTest *this_local;
  
  gl._4_4_ = 0;
  ppGStack_58 = src_pixels;
  src_pixels_local = dst_pixels;
  dst_pixels_local = (GLubyte **)test_case;
  test_case_local = (testCase *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _dst_layer_step = CONCAT44(extraout_var,iVar1);
  uStack_6c = 1;
  src_layer_step = 0;
  n_layers._3_1_ = Utils::isTargetMultilayer(*(GLenum *)dst_pixels_local);
  n_layers._2_1_ = Utils::isTargetMultilayer(*(GLenum *)((long)dst_pixels_local + 0x24));
  n_layers._1_1_ = 0;
  dst_layer = 0;
  src_layer = 1;
  if (((n_layers._3_1_ & 1) == 1) || ((bool)n_layers._2_1_)) {
    if (n_layers._2_1_ == (n_layers._3_1_ & 1)) {
      uStack_6c = 0xc;
    }
    else {
      bVar6 = (n_layers._3_1_ & 1) != 1;
      if (!bVar6) {
        src_layer_step = 1;
      }
      dst_layer = (GLuint)bVar6;
      src_layer = 0xc;
    }
  }
  layer = 0;
  local_84 = 0;
  local_88 = 0;
  while( true ) {
    if (src_layer <= local_88) {
      return true;
    }
    if (this->m_rb_name == 0) {
      (**(code **)(_dst_layer_step + 0x310))
                (this->m_src_tex_name,*(undefined4 *)((long)dst_pixels_local + 0x24),
                 *(undefined4 *)(dst_pixels_local + 6),*(undefined4 *)(dst_pixels_local + 8),
                 *(undefined4 *)((long)dst_pixels_local + 0x44),local_84,this->m_dst_tex_name,
                 *(undefined4 *)dst_pixels_local,*(undefined4 *)((long)dst_pixels_local + 0xc),
                 *(undefined4 *)((long)dst_pixels_local + 0x1c),
                 *(undefined4 *)(dst_pixels_local + 4),layer,*(undefined4 *)(dst_pixels_local + 9),
                 *(undefined4 *)((long)dst_pixels_local + 0x4c),uStack_6c);
    }
    else {
      (**(code **)(_dst_layer_step + 0x310))
                (this->m_src_tex_name,0xde1,*(undefined4 *)(dst_pixels_local + 6),
                 *(undefined4 *)(dst_pixels_local + 8),
                 *(undefined4 *)((long)dst_pixels_local + 0x44),local_84,this->m_rb_name,
                 *(undefined4 *)((long)dst_pixels_local + 0x24),
                 *(undefined4 *)(dst_pixels_local + 6),*(undefined4 *)(dst_pixels_local + 8),
                 *(undefined4 *)((long)dst_pixels_local + 0x44),local_84,
                 *(undefined4 *)(dst_pixels_local + 9),
                 *(undefined4 *)((long)dst_pixels_local + 0x4c),uStack_6c);
      (**(code **)(_dst_layer_step + 0x310))
                (this->m_rb_name,*(undefined4 *)((long)dst_pixels_local + 0x24),
                 *(undefined4 *)(dst_pixels_local + 6),*(undefined4 *)(dst_pixels_local + 8),
                 *(undefined4 *)((long)dst_pixels_local + 0x44),local_84,this->m_dst_tex_name,
                 *(undefined4 *)dst_pixels_local,*(undefined4 *)((long)dst_pixels_local + 0xc),
                 *(undefined4 *)((long)dst_pixels_local + 0x1c),
                 *(undefined4 *)(dst_pixels_local + 4),layer,*(undefined4 *)(dst_pixels_local + 9),
                 *(undefined4 *)((long)dst_pixels_local + 0x4c),uStack_6c);
    }
    gl._4_4_ = (**(code **)(_dst_layer_step + 0x800))();
    if (gl._4_4_ == 0) {
      iVar1 = verify(this,(EVP_PKEY_CTX *)dst_pixels_local,(uchar *)(ulong)layer,
                     (size_t)src_pixels_local,(uchar *)(ulong)local_84,(size_t)ppGStack_58);
      n_layers._1_1_ = (byte)iVar1 & 1;
    }
    if ((gl._4_4_ != 0) || ((n_layers._1_1_ & 1) == 0)) break;
    layer = src_layer_step + layer;
    local_84 = dst_layer + local_84;
    local_88 = local_88 + 1;
  }
  pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  tcu::TestLog::operator<<(&local_208,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_208,(char (*) [23])"Failure. Targets src: ");
  EVar7 = glu::getTextureTargetStr(*(int *)((long)dst_pixels_local + 0x24));
  local_238 = EVar7.m_getName;
  local_230 = EVar7.m_value;
  local_228[0].m_getName = local_238;
  local_228[0].m_value = local_230;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_228);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])", dst: ");
  EVar7 = glu::getTextureTargetStr(*(int *)dst_pixels_local);
  local_258 = EVar7.m_getName;
  local_250 = EVar7.m_value;
  local_248.m_getName = local_258;
  local_248.m_value = local_250;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_248);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])". Levels src: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(dst_pixels_local + 6));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])", dst: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)dst_pixels_local + 0xc));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [20])". Dimmensions src [");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(dst_pixels_local + 5));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)dst_pixels_local + 0x2c));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])"], dst [");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)dst_pixels_local + 4));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(dst_pixels_local + 1));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"]. Region [");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(dst_pixels_local + 9));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])" x ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)dst_pixels_local + 0x4c));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])" x ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xffffffffffffff94);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])"] from [");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(dst_pixels_local + 8));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)dst_pixels_local + 0x44));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_84);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])"] to [");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)dst_pixels_local + 0x1c));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)(dst_pixels_local + 4));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&layer);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])"]. Format src: ");
  EVar7 = glu::getInternalFormatParameterStr(*(int *)((long)dst_pixels_local + 0x34));
  local_278 = EVar7.m_getName;
  local_270 = EVar7.m_value;
  local_268.m_getName = local_278;
  local_268.m_value = local_270;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_268);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])", dst: ");
  EVar7 = glu::getInternalFormatParameterStr(*(int *)(dst_pixels_local + 2));
  local_298 = EVar7.m_getName;
  local_290 = EVar7.m_value;
  local_288.m_getName = local_298;
  local_288.m_value = local_290;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_288);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_208);
  if (gl._4_4_ == 0) {
    return false;
  }
  pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  tcu::TestLog::operator<<(&local_418,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_418,(char (*) [22])"Failed due to error: ");
  EVar7 = glu::getErrorStr(gl._4_4_);
  local_428.m_getName = EVar7.m_getName;
  local_428.m_value = EVar7.m_value;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_428);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_418);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Copy operation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
             ,0xb7f);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool FunctionalTest::copyAndVerify(const testCase& test_case, const GLubyte** dst_pixels, const GLubyte** src_pixels)
{
	GLenum			 error				= GL_NO_ERROR;
	const Functions& gl					= m_context.getRenderContext().getFunctions();
	GLuint			 region_depth		= 1;
	GLuint			 dst_layer_step		= 0;
	const bool		 is_dst_multi_layer = Utils::isTargetMultilayer(test_case.m_dst.m_target);
	const bool		 is_src_multi_layer = Utils::isTargetMultilayer(test_case.m_src.m_target);
	bool			 result				= false;
	GLuint			 src_layer_step		= 0;
	GLuint			 n_layers			= 1;

	/* Configure layers */
	if ((true == is_dst_multi_layer) || (true == is_src_multi_layer))
	{
		if (is_src_multi_layer == is_dst_multi_layer)
		{
			/* Both objects are multilayered, copy all layers at once, verify at once */
			region_depth = FUNCTIONAL_TEST_N_LAYERS;
		}
		else if (true == is_dst_multi_layer)
		{
			/* Destination is multilayered, copy each layer separetly, verify at once */
			n_layers	   = FUNCTIONAL_TEST_N_LAYERS;
			dst_layer_step = 1;
		}
		else
		{
			/* Destination is multilayered, copy and verify each layer separetly */
			n_layers	   = FUNCTIONAL_TEST_N_LAYERS;
			src_layer_step = 1;
		}
	}

	/* Copy and verification */
	{
		GLuint dst_layer = 0;
		GLuint src_layer = 0;

		/* For each layer */
		for (GLuint layer = 0; layer < n_layers; ++layer)
		{
			if (0 == m_rb_name)
			{
				gl.copyImageSubData(m_src_tex_name, test_case.m_src.m_target, test_case.m_src.m_level,
									test_case.m_src_x, test_case.m_src_y, src_layer, m_dst_tex_name,
									test_case.m_dst.m_target, test_case.m_dst.m_level, test_case.m_dst_x,
									test_case.m_dst_y, dst_layer, test_case.m_width, test_case.m_height, region_depth);
			}
			else /* Copy from src to rb and from rb to dst */
			{
				/* Src and rb shares differs only on target */
				gl.copyImageSubData(m_src_tex_name, GL_TEXTURE_2D, test_case.m_src.m_level, test_case.m_src_x,
									test_case.m_src_y, src_layer, m_rb_name, test_case.m_src.m_target,
									test_case.m_src.m_level, test_case.m_src_x, test_case.m_src_y, src_layer,
									test_case.m_width, test_case.m_height, region_depth);

				gl.copyImageSubData(m_rb_name, test_case.m_src.m_target, test_case.m_src.m_level, test_case.m_src_x,
									test_case.m_src_y, src_layer, m_dst_tex_name, test_case.m_dst.m_target,
									test_case.m_dst.m_level, test_case.m_dst_x, test_case.m_dst_y, dst_layer,
									test_case.m_width, test_case.m_height, region_depth);
			}

			/* Verify generated error */
			error = gl.getError();

			if (GL_NO_ERROR == error)
			{
				/* Verify copy results */
				result = verify(test_case, dst_layer, dst_pixels, src_layer, src_pixels, region_depth);
			}

			if ((GL_NO_ERROR != error) || (false == result))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Failure. Targets src: " << glu::getTextureTargetStr(test_case.m_src.m_target)
					<< ", dst: " << glu::getTextureTargetStr(test_case.m_dst.m_target)
					<< ". Levels src: " << test_case.m_src.m_level << ", dst: " << test_case.m_dst.m_level
					<< ". Dimmensions src [" << test_case.m_src.m_width << ", " << test_case.m_src.m_height
					<< "], dst [" << test_case.m_dst.m_width << ", " << test_case.m_dst.m_height << "]. Region ["
					<< test_case.m_width << " x " << test_case.m_height << " x " << region_depth << "] from ["
					<< test_case.m_src_x << ", " << test_case.m_src_y << ", " << src_layer << "] to ["
					<< test_case.m_dst_x << ", " << test_case.m_dst_y << ", " << dst_layer
					<< "]. Format src: " << glu::getInternalFormatParameterStr(test_case.m_src.m_internal_format)
					<< ", dst: " << glu::getInternalFormatParameterStr(test_case.m_dst.m_internal_format)
					<< tcu::TestLog::EndMessage;

				if (GL_NO_ERROR != error)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message
														<< "Failed due to error: " << glu::getErrorStr(error)
														<< tcu::TestLog::EndMessage;

					TCU_FAIL("Copy operation failed");
				}

				return false;
			}

			/* Step one layer */
			dst_layer += dst_layer_step;
			src_layer += src_layer_step;
		}
	}

	return true;
}